

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstr.cpp
# Opt level: O2

int lstrlenA(LPCSTR lpString)

{
  long lVar1;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  lVar1 = 0;
  if (lpString != (LPCSTR)0x0) {
    for (; lpString[lVar1] != '\0'; lVar1 = lVar1 + 1) {
    }
  }
  return (int)lVar1;
}

Assistant:

int
PALAPI
lstrlenA( IN LPCSTR lpString)
{
    int nChar = 0;

    PERF_ENTRY(lstrlenA);
    ENTRY("lstrlenA (lpString=%p (%s))\n", lpString?lpString:"NULL", lpString?lpString:"NULL");
    if (lpString)
    {
        while (*lpString++)
        {
            nChar++;      
        }
    }
    LOGEXIT("lstrlenA returning int %d\n", nChar);
    PERF_EXIT(lstrlenA);
    return nChar;
}